

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

iterator * __thiscall
linq::
IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
::begin(iterator *__return_storage_ptr__,
       IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>_>
       *this)

{
  WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
  src;
  undefined8 in_RAX;
  iterator *extraout_RAX;
  iterator *extraout_RAX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  undefined8 unaff_RBX;
  undefined8 unaff_R14;
  undefined1 in_stack_00000000 [16];
  
  if (in_RDX != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      in_RDX->_M_use_count = in_RDX->_M_use_count + 1;
      UNLOCK();
    }
    else {
      in_RDX->_M_use_count = in_RDX->_M_use_count + 1;
    }
  }
  src.source.super_IState<int>._vptr_IState = (_func_int **)unaff_RBX;
  src.super_IState<int>._vptr_IState = (_func_int **)in_RAX;
  src.source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)unaff_R14;
  src._24_16_ = in_stack_00000000;
  iterator::iterator(__return_storage_ptr__,src,SUB81(this,0));
  if (in_RDX != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_RDX);
    return extraout_RAX_00;
  }
  return extraout_RAX;
}

Assistant:

iterator begin() { return iterator(source); }